

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastDivider(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes
                     )

{
  int iCtrl;
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iLit0;
  int iData1;
  long lVar6;
  void *__ptr;
  void *__ptr_00;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  uint local_ac;
  int *local_58;
  
  vRes->nSize = 0;
  uVar7 = (ulong)(uint)nNum;
  if (0 < nNum) {
    uVar11 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  piVar1 = vRes->pArray;
  lVar6 = (long)nNum;
  __ptr = malloc(lVar6 * 4);
  __ptr_00 = malloc(lVar6 * 4);
  if (nNum != nDiv) {
    __assert_fail("nNum == nDiv",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x1ae,
                  "void Wlc_BlastDivider(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  if (0 < nNum) {
    lVar9 = lVar6 + -1;
    local_58 = pDiv + -lVar6;
    lVar6 = lVar9;
    piVar10 = pDiv;
    do {
      local_58 = local_58 + 1;
      uVar3 = 0;
      lVar8 = lVar9;
      piVar13 = piVar10;
      local_ac = uVar3;
      if (0 < lVar6) {
        uVar3 = 0;
        lVar12 = lVar9;
        do {
          uVar3 = Gia_ManHashOr(pNew,uVar3,pDiv[lVar12]);
          if (uVar3 == 1) {
            *(undefined4 *)((long)__ptr + lVar6 * 4) = 0;
            goto LAB_003048be;
          }
          lVar12 = lVar12 + -1;
          local_ac = uVar3;
        } while ((long)((ulong)(nNum - 1) - lVar6) < lVar12);
      }
      do {
        iVar5 = 0;
        if (lVar6 <= lVar8) {
          iVar5 = *piVar13;
        }
        if (piVar1[lVar8] < 0) goto LAB_00304958;
        iVar4 = Gia_ManHashAnd(pNew,iVar5,piVar1[lVar8] ^ 1);
        local_ac = Gia_ManHashMux(pNew,uVar3,local_ac,iVar4);
        *(uint *)((long)__ptr + lVar6 * 4) = local_ac;
        iVar5 = Gia_ManHashXor(pNew,iVar5,piVar1[lVar8]);
        uVar3 = Gia_ManHashOr(pNew,uVar3,iVar5);
        if (lVar8 < 1) break;
        lVar8 = lVar8 + -1;
        piVar13 = piVar13 + -1;
      } while (uVar3 != 1);
      if ((int)local_ac < 0) {
LAB_00304958:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf4,"int Abc_LitNot(int)");
      }
      *(uint *)((long)__ptr + lVar6 * 4) = local_ac ^ 1;
      if (local_ac != 1) {
        uVar11 = 0;
        iVar5 = 0;
        do {
          uVar3 = piVar1[uVar11];
          if ((int)uVar3 < 0) goto LAB_00304958;
          iLit0 = Gia_ManHashMux(pNew,iVar5,uVar3 ^ 1,uVar3);
          iVar4 = 0;
          if (lVar6 <= (long)uVar11) {
            iVar4 = local_58[uVar11];
          }
          iCtrl = piVar1[uVar11];
          iData1 = Gia_ManHashAnd(pNew,iVar5,iVar4);
          iVar5 = Gia_ManHashOr(pNew,iVar5,iVar4);
          iVar5 = Gia_ManHashMux(pNew,iCtrl,iData1,iVar5);
          iVar4 = Gia_ManHashXor(pNew,iLit0,iVar4);
          *(int *)((long)__ptr_00 + uVar11 * 4) = iVar4;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
        if (local_ac == 0) {
          vRes->nSize = 0;
          uVar11 = 0;
          do {
            Vec_IntPush(vRes,*(int *)((long)__ptr_00 + uVar11 * 4));
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        else {
          uVar11 = 0;
          do {
            iVar5 = Gia_ManHashMux(pNew,local_ac ^ 1,*(int *)((long)__ptr_00 + uVar11 * 4),
                                   piVar1[uVar11]);
            piVar1[uVar11] = iVar5;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
      }
LAB_003048be:
      piVar10 = piVar10 + 1;
      bVar2 = 0 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if ((fQuo == 0) || (vRes->nSize = 0, nNum < 1)) {
    if (__ptr == (void *)0x0) {
      return;
    }
  }
  else {
    uVar11 = 0;
    do {
      Vec_IntPush(vRes,*(int *)((long)__ptr + uVar11 * 4));
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  free(__ptr);
  return;
}

Assistant:

void Wlc_BlastDivider( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int * pQuo  = ABC_ALLOC( int, nNum );
    int * pTemp = ABC_ALLOC( int, nNum );
    int i, j, known, borrow, y_bit, top_bit;
    assert( nNum == nDiv );
    for ( j = nNum - 1; j >= 0; j-- ) 
    {
        known = 0;
        for ( i = nNum - 1; i > nNum - 1 - j; i-- ) 
        {
            known = Gia_ManHashOr( pNew, known, pDiv[i] );
            if( known == 1 ) 
                break;
        }
        pQuo[j] = known;
        for ( i = nNum - 1; i >= 0; i-- ) 
        {
            if ( known == 1 ) 
                break;
            y_bit = (i >= j) ? pDiv[i-j] : 0;
            pQuo[j] = Gia_ManHashMux( pNew, known, pQuo[j], Gia_ManHashAnd( pNew, y_bit, Abc_LitNot(pRes[i]) ) );
            known = Gia_ManHashOr( pNew, known, Gia_ManHashXor(pNew, y_bit, pRes[i]));
        }
        pQuo[j] = Abc_LitNot(pQuo[j]);
        if ( pQuo[j] == 0 )
            continue;
        borrow = 0;
        for ( i = 0; i < nNum; i++ ) 
        {
            top_bit  = Gia_ManHashMux( pNew, borrow, Abc_LitNot(pRes[i]), pRes[i] );
            y_bit    = (i >= j) ? pDiv[i-j] : 0;
            borrow   = Gia_ManHashMux( pNew, pRes[i], Gia_ManHashAnd(pNew, borrow, y_bit), Gia_ManHashOr(pNew, borrow, y_bit) );
            pTemp[i] = Gia_ManHashXor( pNew, top_bit, y_bit );
        }
        if ( pQuo[j] == 1 ) 
            Wlc_VecCopy( vRes, pTemp, nNum );
        else 
            for( i = 0; i < nNum; i++ ) 
                pRes[i] = Gia_ManHashMux( pNew, pQuo[j], pTemp[i], pRes[i] );
    }
    ABC_FREE( pTemp );
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    ABC_FREE( pQuo );
}